

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall MemoryAccountant::~MemoryAccountant(MemoryAccountant *this)

{
  clear(this);
  return;
}

Assistant:

MemoryAccountant::~MemoryAccountant()
{
    clear();
}